

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::CheckerVisitor::checkAssignmentToItself(CheckerVisitor *this,BinExpr *expr)

{
  bool bVar1;
  Node *rhs;
  Node *lhs;
  
  if ((this->effectsOnly != false) || ((expr->super_Expr).super_Node._op != TO_ASSIGN)) {
    return;
  }
  rhs = &expr->_rhs->super_Node;
  for (lhs = &expr->_lhs->super_Node; lhs != (Node *)0x0;
      lhs = (Node *)(((Node *)&lhs[1].super_ArenaObj)->super_ArenaObj)._vptr_ArenaObj) {
    if (lhs->_op != TO_PAREN) goto LAB_0014fd62;
  }
  lhs = (Node *)0x0;
LAB_0014fd62:
  do {
    if (rhs == (Node *)0x0) {
      rhs = (Node *)0x0;
LAB_0014fd75:
      bVar1 = NodeEqualChecker::check((NodeEqualChecker *)&this->field_0x20,lhs,rhs);
      if (!bVar1) {
        return;
      }
      report(this,(Node *)expr,0x40);
      return;
    }
    if (rhs->_op != TO_PAREN) goto LAB_0014fd75;
    rhs = (Node *)rhs[1].super_ArenaObj._vptr_ArenaObj;
  } while( true );
}

Assistant:

void CheckerVisitor::checkAssignmentToItself(const BinExpr *expr) {
  if (effectsOnly)
    return;

  const Expr *l = expr->lhs();
  const Expr *r = expr->rhs();

  if (expr->op() == TO_ASSIGN) {
    auto *ll = deparen(l);
    auto *rr = deparen(r);

    if (_equalChecker.check(ll, rr)) {
      report(expr, DiagnosticsId::DI_ASG_TO_ITSELF);
    }
  }
}